

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O3

CImg<unsigned_char> * __thiscall
cimg_library::CImg<unsigned_char>::load_imagemagick_external
          (CImg<unsigned_char> *this,char *filename)

{
  char cVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  size_t sVar5;
  CImg<char> *pCVar6;
  char *pcVar7;
  char *pcVar8;
  char *pcVar9;
  FILE *pFVar10;
  char *pcVar11;
  CImgArgumentException *this_00;
  CImgIOException *pCVar12;
  long lVar13;
  ulong uVar14;
  char *pcVar15;
  char cVar16;
  char cVar17;
  CImg<char> local_b0;
  CImg<char> filename_tmp;
  CImg<char> command;
  CImg<char> s_filename;
  
  if (filename == (char *)0x0) {
    this_00 = (CImgArgumentException *)__cxa_allocate_exception(0x10);
    pcVar7 = "non-";
    if (this->_is_shared != false) {
      pcVar7 = "";
    }
    CImgArgumentException::CImgArgumentException
              (this_00,
               "[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::load_imagemagick_external(): Specified filename is (null)."
               ,(ulong)this->_width,(ulong)this->_height,(ulong)this->_depth,(ulong)this->_spectrum,
               this->_data,pcVar7,"unsigned char");
    __cxa_throw(this_00,&CImgArgumentException::typeinfo,CImgException::~CImgException);
  }
  if ((*filename != '-') || ((pFVar10 = _stdin, filename[1] != '.' && (filename[1] != '\0')))) {
    pFVar10 = fopen(filename,"rb");
  }
  if (pFVar10 == (FILE *)0x0) {
    pCVar12 = (CImgIOException *)__cxa_allocate_exception(0x10);
    CImgIOException::CImgIOException
              (pCVar12,"cimg::fopen(): Failed to open file \'%s\' with mode \'%s\'.",filename,"rb");
    __cxa_throw(pCVar12,&CImgIOException::typeinfo,CImgException::~CImgException);
  }
  if (((_stdin != pFVar10) && (_stdout != pFVar10)) && (uVar2 = fclose(pFVar10), uVar2 != 0)) {
    cimg::warn("cimg::fclose(): Error code %d returned during file closing.",(ulong)uVar2);
  }
  CImg<char>::CImg(&command,0x400,1,1,1);
  CImg<char>::CImg(&filename_tmp,0x100,1,1,1);
  sVar5 = strlen(filename);
  CImg<char>::CImg(&local_b0,filename,(int)sVar5 + 1,1,1,1,false);
  pCVar6 = CImg<char>::_system_strescape(&local_b0);
  CImg<char>::CImg(&s_filename,pCVar6);
  if ((local_b0._is_shared == false) && (local_b0._data != (char *)0x0)) {
    operator_delete__(local_b0._data);
  }
  pcVar7 = (char *)operator_new__(0x25);
  builtin_strncpy(pcVar7,"which convert >/dev/null 2>&1",0x1e);
  iVar3 = system(pcVar7);
  operator_delete__(pcVar7);
  pcVar7 = command._data;
  if (iVar3 == 0) {
    uVar14 = (ulong)command._width;
    pcVar9 = cimg::imagemagick_path((char *)0x0,false);
    pcVar8 = filename;
    do {
      pcVar15 = pcVar8;
      pcVar11 = strchr(pcVar15,0x2e);
      pcVar8 = pcVar11 + 1;
    } while (filename <= pcVar11 + 1);
    if (((pcVar15 == filename) || (pcVar8 = strchr(pcVar15,0x2f), pcVar8 != (char *)0x0)) ||
       (pcVar8 = strchr(pcVar15,0x5c), pcVar8 != (char *)0x0)) {
      sVar5 = strlen(filename);
      pcVar15 = filename + sVar5;
    }
    sVar5 = strlen(pcVar15);
    iVar4 = (int)sVar5;
    iVar3 = 3;
    if (iVar4 < 3) {
      iVar3 = iVar4;
    }
    if ((iVar3 != -1) && (-1 < iVar4)) {
      iVar3 = 3;
      if (iVar4 < 3) {
        iVar3 = iVar4;
      }
      lVar13 = 0;
      do {
        cVar1 = pcVar15[lVar13];
        cVar16 = cVar1 + ' ';
        if ((byte)(cVar1 + 0xa5U) < 0xe6) {
          cVar16 = cVar1;
        }
        cVar1 = "pdf"[lVar13];
        cVar17 = cVar1 + ' ';
        if ((byte)(cVar1 + 0xa5U) < 0xe6) {
          cVar17 = cVar1;
        }
        if (cVar16 != cVar17) {
          iVar3 = 3;
          if (iVar4 < 3) {
            iVar3 = iVar4;
          }
          if ((-1 < iVar4) && (iVar3 + 1 != (int)lVar13)) {
            pcVar8 = "";
            goto LAB_001ba58e;
          }
          break;
        }
        lVar13 = lVar13 + 1;
      } while (iVar3 + 1 != (int)lVar13);
    }
    pcVar8 = " -density 400x400";
LAB_001ba58e:
    snprintf(pcVar7,uVar14,"%s%s \"%s\" pnm:-",pcVar9,pcVar8,s_filename._data);
    pFVar10 = popen(command._data,"r");
    if (pFVar10 != (FILE *)0x0) {
      cimg::exception_mode(0,true);
      _load_pnm(this,(FILE *)pFVar10,(char *)0x0);
      pclose(pFVar10);
      goto LAB_001ba5f2;
    }
  }
  while( true ) {
    pcVar7 = filename_tmp._data;
    uVar14 = (ulong)filename_tmp._width;
    pcVar8 = cimg::temporary_path((char *)0x0,false);
    pcVar9 = cimg::filenamerand();
    snprintf(pcVar7,uVar14,"%s%c%s.pnm",pcVar8,0x2f,pcVar9);
    pFVar10 = fopen(filename_tmp._data,"rb");
    pcVar7 = command._data;
    if (pFVar10 == (FILE *)0x0) break;
    if (((_stdin != pFVar10) && (_stdout != pFVar10)) && (iVar3 = fclose(pFVar10), iVar3 != 0)) {
      cimg::warn("cimg::fclose(): Error code %d returned during file closing.");
    }
  }
  pcVar9 = cimg::imagemagick_path((char *)0x0,false);
  pcVar8 = filename;
  do {
    pcVar15 = pcVar8;
    pcVar11 = strchr(pcVar15,0x2e);
    pcVar8 = pcVar11 + 1;
  } while (filename <= pcVar11 + 1);
  if (((pcVar15 == filename) || (pcVar8 = strchr(pcVar15,0x2f), pcVar8 != (char *)0x0)) ||
     (pcVar8 = strchr(pcVar15,0x5c), pcVar8 != (char *)0x0)) {
    sVar5 = strlen(filename);
    pcVar15 = filename + sVar5;
  }
  sVar5 = strlen(pcVar15);
  pcVar8 = s_filename._data;
  iVar4 = (int)sVar5;
  iVar3 = 3;
  if (iVar4 < 3) {
    iVar3 = iVar4;
  }
  if ((iVar3 != -1) && (-1 < iVar4)) {
    iVar3 = 3;
    if (iVar4 < 3) {
      iVar3 = iVar4;
    }
    lVar13 = 0;
    do {
      cVar1 = pcVar15[lVar13];
      cVar16 = cVar1 + ' ';
      if ((byte)(cVar1 + 0xa5U) < 0xe6) {
        cVar16 = cVar1;
      }
      cVar1 = "pdf"[lVar13];
      cVar17 = cVar1 + ' ';
      if ((byte)(cVar1 + 0xa5U) < 0xe6) {
        cVar17 = cVar1;
      }
      if (cVar16 != cVar17) {
        iVar3 = 3;
        if (iVar4 < 3) {
          iVar3 = iVar4;
        }
        if ((-1 < iVar4) && (iVar3 + 1 != (int)lVar13)) {
          pcVar15 = "";
          goto LAB_001ba432;
        }
        break;
      }
      lVar13 = lVar13 + 1;
    } while (iVar3 + 1 != (int)lVar13);
  }
  pcVar15 = " -density 400x400";
LAB_001ba432:
  CImg<char>::string(&local_b0,filename_tmp._data,true,false);
  pCVar6 = CImg<char>::_system_strescape(&local_b0);
  snprintf(pcVar7,(ulong)command._width,"%s%s \"%s\" \"%s\"",pcVar9,pcVar15,pcVar8,pCVar6->_data);
  if ((local_b0._is_shared == false) && (local_b0._data != (char *)0x0)) {
    operator_delete__(local_b0._data);
  }
  pcVar7 = command._data;
  cimg::imagemagick_path((char *)0x0,false);
  sVar5 = strlen(pcVar7);
  uVar14 = sVar5 & 0xffffffff;
  if (uVar14 != 0) {
    pcVar8 = (char *)operator_new__((ulong)((int)sVar5 + 0x18));
    memcpy(pcVar8,pcVar7,uVar14);
    builtin_strncpy(pcVar8 + uVar14," >/dev/null 2>&1",0x11);
    system(pcVar8);
    operator_delete__(pcVar8);
  }
  pFVar10 = fopen(filename_tmp._data,"rb");
  if (pFVar10 == (FILE *)0x0) {
    pFVar10 = cimg::fopen(filename,"r");
    cimg::fclose(pFVar10);
    pCVar12 = (CImgIOException *)__cxa_allocate_exception(0x10);
    pcVar7 = "non-";
    if (this->_is_shared != false) {
      pcVar7 = "";
    }
    CImgIOException::CImgIOException
              (pCVar12,
               "[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::load_imagemagick_external(): Failed to load file \'%s\' with external command \'magick/convert\'."
               ,(ulong)this->_width,(ulong)this->_height,(ulong)this->_depth,(ulong)this->_spectrum,
               this->_data,pcVar7,"unsigned char",filename);
    __cxa_throw(pCVar12,&CImgIOException::typeinfo,CImgException::~CImgException);
  }
  if (((_stdin != pFVar10) && (_stdout != pFVar10)) && (iVar3 = fclose(pFVar10), iVar3 != 0)) {
    cimg::warn("cimg::fclose(): Error code %d returned during file closing.");
  }
  _load_pnm(this,(FILE *)0x0,filename_tmp._data);
  remove(filename_tmp._data);
LAB_001ba5f2:
  if ((s_filename._is_shared == false) && (s_filename._data != (char *)0x0)) {
    operator_delete__(s_filename._data);
  }
  if ((filename_tmp._is_shared == false) && (filename_tmp._data != (char *)0x0)) {
    operator_delete__(filename_tmp._data);
  }
  if ((command._is_shared == false) && (command._data != (char *)0x0)) {
    operator_delete__(command._data);
  }
  return this;
}

Assistant:

CImg<T>& load_imagemagick_external(const char *const filename) {
      if (!filename)
        throw CImgArgumentException(_cimg_instance
                                    "load_imagemagick_external(): Specified filename is (null).",
                                    cimg_instance);
      cimg::fclose(cimg::fopen(filename,"rb")); // Check if file exists
      CImg<charT> command(1024), filename_tmp(256);
      std::FILE *file = 0;
      const CImg<charT> s_filename = CImg<charT>::string(filename)._system_strescape();
#if cimg_OS==1
      if (!cimg::system("which convert")) {
        cimg_snprintf(command,command._width,"%s%s \"%s\" pnm:-",
                      cimg::imagemagick_path(),
                      !cimg::strcasecmp(cimg::split_filename(filename),"pdf")?" -density 400x400":"",
                      s_filename.data());
        file = popen(command,"r");
        if (file) {
          const unsigned int omode = cimg::exception_mode();
          cimg::exception_mode(0);
          try { load_pnm(file); } catch (...) {
            pclose(file);
            cimg::exception_mode(omode);
            throw CImgIOException(_cimg_instance
                                  "load_imagemagick_external(): Failed to load file '%s' with "
                                  "external command 'magick/convert'.",
                                  cimg_instance,
                                  filename);
          }
          pclose(file);
          return *this;
        }
      }
#endif
      do {
        cimg_snprintf(filename_tmp,filename_tmp._width,"%s%c%s.pnm",
                      cimg::temporary_path(),cimg_file_separator,cimg::filenamerand());
        if ((file=cimg::std_fopen(filename_tmp,"rb"))!=0) cimg::fclose(file);
      } while (file);
      cimg_snprintf(command,command._width,"%s%s \"%s\" \"%s\"",
                    cimg::imagemagick_path(),
                    !cimg::strcasecmp(cimg::split_filename(filename),"pdf")?" -density 400x400":"",
                    s_filename.data(),CImg<charT>::string(filename_tmp)._system_strescape().data());
      cimg::system(command,cimg::imagemagick_path());
      if (!(file=cimg::std_fopen(filename_tmp,"rb"))) {
        cimg::fclose(cimg::fopen(filename,"r"));
        throw CImgIOException(_cimg_instance
                              "load_imagemagick_external(): Failed to load file '%s' with "
                              "external command 'magick/convert'.",
                              cimg_instance,
                              filename);

      } else cimg::fclose(file);
      load_pnm(filename_tmp);
      std::remove(filename_tmp);
      return *this;
    }